

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O3

int fy_attach_comments_if_any(fy_parser *fyp,fy_token *fyt)

{
  size_t sVar1;
  size_t sVar2;
  fy_input *pfVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar7 = -1;
  if (fyt != (fy_token *)0x0 && fyp != (fy_parser *)0x0) {
    if ((((fyp->cfg).flags & FYPCF_PARSE_COMMENTS) != FYPCF_COLOR_AUTO) &&
       ((fyp->last_comment).fyi != (fy_input *)0x0)) {
      uVar4 = *(undefined4 *)&(fyp->last_comment).field_0x34;
      fyt->comment[0].increment = (fyp->last_comment).increment;
      *(undefined4 *)&fyt->comment[0].field_0x34 = uVar4;
      sVar1 = (fyp->last_comment).start_mark.input_pos;
      iVar5 = (fyp->last_comment).start_mark.line;
      iVar6 = (fyp->last_comment).start_mark.column;
      sVar2 = (fyp->last_comment).end_mark.input_pos;
      iVar7 = (fyp->last_comment).end_mark.line;
      iVar8 = (fyp->last_comment).end_mark.column;
      pfVar3 = (fyp->last_comment).fyi;
      fyt->comment[0].storage_hint = (fyp->last_comment).storage_hint;
      fyt->comment[0].fyi = pfVar3;
      fyt->comment[0].end_mark.input_pos = sVar2;
      fyt->comment[0].end_mark.line = iVar7;
      fyt->comment[0].end_mark.column = iVar8;
      fyt->comment[0].start_mark.input_pos = sVar1;
      fyt->comment[0].start_mark.line = iVar5;
      fyt->comment[0].start_mark.column = iVar6;
      (fyp->last_comment).start_mark.input_pos = 0;
      (fyp->last_comment).start_mark.line = 0;
      (fyp->last_comment).start_mark.column = 0;
      (fyp->last_comment).end_mark.input_pos = 0;
      (fyp->last_comment).end_mark.line = 0;
      (fyp->last_comment).end_mark.column = 0;
      (fyp->last_comment).storage_hint = 0;
      (fyp->last_comment).fyi = (fy_input *)0x0;
      *(undefined8 *)&(fyp->last_comment).increment = 0;
    }
    while( true ) {
      iVar7 = fy_parse_peek_at_offset(fyp,0);
      if ((iVar7 != 9) && (iVar7 != 0x20)) break;
      fy_advance(fyp,iVar7);
    }
    if (iVar7 == 0x23) {
      iVar7 = 0;
      iVar8 = fy_scan_comment(fyp,fyt->comment + 1,false);
      if (iVar8 != 0) {
        fy_parser_diag(fyp,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,700,"fy_attach_comments_if_any","fy_scan_comment() failed");
        iVar7 = -1;
      }
    }
    else {
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int fy_attach_comments_if_any(struct fy_parser *fyp, struct fy_token *fyt) {
    int c, rc;

    if (!fyp || !fyt)
        return -1;

    /* if a last comment exists and is valid */
    if ((fyp->cfg.flags & FYPCF_PARSE_COMMENTS) &&
        fy_atom_is_set(&fyp->last_comment)) {
        memcpy(&fyt->comment[fycp_top], &fyp->last_comment, sizeof(fyp->last_comment));
        memset(&fyp->last_comment, 0, sizeof(fyp->last_comment));
    }

    /* right hand comment */

    /* skip white space */
    while (fy_is_ws(c = fy_parse_peek(fyp)))
        fy_advance(fyp, c);

    if (c == '#') {
        rc = fy_scan_comment(fyp, &fyt->comment[fycp_right], false);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_scan_comment() failed");
    }
    return 0;

    err_out_rc:
    return rc;
}